

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O0

int __thiscall
ON_String::Compare(ON_String *this,ON_String *other_string,ON_Locale *locale,bool bIgnoreCase)

{
  int iVar1;
  int element_count2;
  char *string1;
  char *string2;
  bool bIgnoreCase_local;
  ON_Locale *locale_local;
  ON_String *other_string_local;
  ON_String *this_local;
  
  string1 = operator_cast_to_char_(this);
  iVar1 = Length(this);
  string2 = operator_cast_to_char_(other_string);
  element_count2 = Length(other_string);
  iVar1 = Compare(string1,iVar1,string2,element_count2,locale,bIgnoreCase);
  return iVar1;
}

Assistant:

int ON_String::Compare(
  const ON_String& other_string,
  const class ON_Locale& locale,
  bool bIgnoreCase
  ) const
{
  return ON_String::Compare(
    static_cast< const char* >(*this),
    this->Length(),
    static_cast< const char* >(other_string),
    other_string.Length(),
    locale,
    bIgnoreCase
    );
}